

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_true>::append_edge_(DaTrie<true,_false,_true> *this,Query *query)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t base_00;
  uint uVar4;
  uint32_t uVar5;
  DaTrie<true,_false,_true> *this_00;
  DaTrie<true,_false,_true> *pDVar6;
  reference pvVar7;
  Query *this_01;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  DaTrie<true,_false,_true> *unaff_retaddr;
  uint32_t child_pos;
  uint32_t base;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_stack_ffffffffffffffd0;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *pvVar8;
  
  pvVar8 = in_RDI;
  uVar3 = Query::node_pos(in_RSI);
  uVar5 = (uint32_t)((ulong)pvVar8 >> 0x20);
  this_00 = (DaTrie<true,_false,_true> *)(ulong)uVar3;
  pDVar6 = (DaTrie<true,_false,_true> *)std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI)
  ;
  if (pDVar6 <= this_00) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x205,
                  "void ddd::DaTrie<true, false, true>::append_edge_(Query &) [WithBLM = true, WithNLM = false, Prefix = true]"
                 );
  }
  uVar3 = Query::node_pos(in_RSI);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
  bVar1 = Bc::is_fixed(pvVar7);
  if (!bVar1) {
    __assert_fail("bc_[query.node_pos()].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x206,
                  "void ddd::DaTrie<true, false, true>::append_edge_(Query &) [WithBLM = true, WithNLM = false, Prefix = true]"
                 );
  }
  Query::label(in_RSI);
  base_00 = xcheck_(this_00,(uint8_t)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffffd0);
  uVar3 = base_00;
  bVar2 = Query::label(in_RSI);
  uVar4 = uVar3 ^ bVar2;
  fix_(unaff_retaddr,uVar5,(vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RSI);
  uVar5 = Query::node_pos(in_RSI);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar5);
  Bc::set_base(pvVar7,base_00);
  this_01 = (Query *)std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4)
  ;
  uVar5 = Query::node_pos(in_RSI);
  Bc::set_check((Bc *)this_01,uVar5);
  Query::next(this_01,uVar3);
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }